

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::WriteCustomCommandsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,cmCustomCommandGenerator *ccg)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmLocalGhsMultiGenerator *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  string *psVar5;
  ulong uVar6;
  long lVar7;
  reference pbVar8;
  ostream *poVar9;
  string_view sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmAlphaNum local_328;
  string local_2f8;
  string_view local_2d8;
  string local_2c8;
  cmAlphaNum local_2a8;
  cmAlphaNum local_278;
  string local_248;
  undefined1 local_221;
  undefined1 local_220 [7];
  bool has_slash;
  byte local_1fa;
  byte local_1f9;
  undefined1 local_1f8 [6];
  bool had_slash;
  bool useCall;
  string cmd;
  uint c;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  allocator<char> local_179;
  undefined1 local_178 [8];
  string cdStr;
  string cdCmd;
  cmAlphaNum local_108;
  undefined1 local_d8 [8];
  string echocmd;
  char *comment;
  string local_a8 [8];
  string check_error;
  string workingDir;
  string local_58 [8];
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmdLines;
  cmCustomCommandGenerator *ccg_local;
  ostream *fout_local;
  cmGhsMultiTargetGenerator *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&dir.field_2 + 8));
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  std::__cxx11::string::string(local_58,(string *)psVar5);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_
            ((string *)((long)&check_error.field_2 + 8),ccg);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::__cxx11::string::operator=(local_58,(string *)(check_error.field_2._M_local_buf + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"if [ $? -ne 0 ]; then exit 1; fi",(allocator<char> *)((long)&comment + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&comment + 7));
  echocmd.field_2._8_8_ = cmCustomCommandGenerator::GetComment(ccg);
  if (((char *)echocmd.field_2._8_8_ != (char *)0x0) && (*(char *)echocmd.field_2._8_8_ != '\0')) {
    cmAlphaNum::cmAlphaNum(&local_108,"echo ");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&cdCmd.field_2 + 8),(char *)echocmd.field_2._8_8_);
    cmStrCat<>((string *)local_d8,&local_108,(cmAlphaNum *)((long)&cdCmd.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&dir.field_2 + 8),(value_type *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
  }
  std::__cxx11::string::string((string *)(cdStr.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_178,"cd ",&local_179);
  std::allocator<char>::~allocator(&local_179);
  pcVar1 = this->LocalGenerator;
  sVar10 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_58);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_1c0,&(pcVar1->super_cmLocalGenerator).super_cmOutputConverter,sVar10,SHELL);
  std::operator+(&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 &local_1c0);
  std::__cxx11::string::operator=((string *)(cdStr.field_2._M_local_buf + 8),(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&dir.field_2 + 8),(value_type *)(cdStr.field_2._M_local_buf + 8));
  cmd.field_2._12_4_ = 0;
  while( true ) {
    uVar2 = cmd.field_2._12_4_;
    uVar4 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    if (uVar4 <= (uint)uVar2) break;
    cmCustomCommandGenerator::GetCommand_abi_cxx11_((string *)local_1f8,ccg,cmd.field_2._12_4_);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      local_1f9 = 0;
      cmsys::SystemTools::ReplaceString((string *)local_1f8,"/./","/");
      lVar7 = std::__cxx11::string::find((char)local_1f8,0x2f);
      local_1fa = lVar7 != -1;
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)local_220,
                   &(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
                   (string *)local_1f8);
        std::__cxx11::string::operator=((string *)local_1f8,(string *)local_220);
        std::__cxx11::string::~string((string *)local_220);
      }
      lVar7 = std::__cxx11::string::find((char)local_1f8,0x2f);
      local_221 = lVar7 != -1;
      if (((local_1fa & 1) != 0) && (!(bool)local_221)) {
        cmAlphaNum::cmAlphaNum(&local_278,"./");
        cmAlphaNum::cmAlphaNum(&local_2a8,(string *)local_1f8);
        cmStrCat<>(&local_248,&local_278,&local_2a8);
        std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_248);
        std::__cxx11::string::~string((string *)&local_248);
      }
      pcVar1 = this->LocalGenerator;
      sVar10 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1f8);
      local_2d8 = sVar10;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_2c8,&(pcVar1->super_cmLocalGenerator).super_cmOutputConverter,sVar10,SHELL);
      std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      if ((local_1f9 & 1) != 0) {
        cmAlphaNum::cmAlphaNum(&local_328,"call ");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1,(string *)local_1f8);
        cmStrCat<>(&local_2f8,&local_328,(cmAlphaNum *)&__range1);
        std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
      }
      cmCustomCommandGenerator::AppendArguments(ccg,cmd.field_2._12_4_,(string *)local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&dir.field_2 + 8),(value_type *)local_1f8);
    }
    std::__cxx11::string::~string((string *)local_1f8);
    cmd.field_2._12_4_ = cmd.field_2._12_4_ + 1;
  }
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&dir.field_2 + 8);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  c_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&c_1);
    if (!bVar3) break;
    pbVar8 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    poVar9 = std::operator<<(fout,(string *)pbVar8);
    poVar9 = std::operator<<(poVar9,'\n');
    poVar9 = std::operator<<(poVar9,local_a8);
    std::operator<<(poVar9,'\n');
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)(cdStr.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)(check_error.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&dir.field_2 + 8));
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteCustomCommandsHelper(
  std::ostream& fout, cmCustomCommandGenerator const& ccg)
{
  std::vector<std::string> cmdLines;

  // if the command specified a working directory use it.
  std::string dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }

  // Line to check for error between commands.
#ifdef _WIN32
  std::string check_error = "if %errorlevel% neq 0 exit /b %errorlevel%";
#else
  std::string check_error = "if [ $? -ne 0 ]; then exit 1; fi";
#endif

#ifdef _WIN32
  cmdLines.push_back("@echo off");
#endif
  // Echo the custom command's comment text.
  const char* comment = ccg.GetComment();
  if (comment && *comment) {
    std::string echocmd = cmStrCat("echo ", comment);
    cmdLines.push_back(std::move(echocmd));
  }

  // Switch to working directory
  std::string cdCmd;
#ifdef _WIN32
  std::string cdStr = "cd /D ";
#else
  std::string cdStr = "cd ";
#endif
  cdCmd = cdStr +
    this->LocalGenerator->ConvertToOutputFormat(dir, cmOutputConverter::SHELL);
  cmdLines.push_back(std::move(cdCmd));

  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

#ifdef _WIN32
      std::string suffix;
      if (cmd.size() > 4) {
        suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
        if (suffix == ".bat" || suffix == ".cmd") {
          useCall = true;
        }
      }
#endif

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->LocalGenerator->MaybeRelativeToCurBinDir(cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = cmStrCat("./", cmd);
      }
      cmd = this->LocalGenerator->ConvertToOutputFormat(
        cmd, cmOutputConverter::SHELL);
      if (useCall) {
        cmd = cmStrCat("call ", cmd);
      }
      ccg.AppendArguments(c, cmd);
      cmdLines.push_back(std::move(cmd));
    }
  }

  // push back the custom commands
  for (auto const& c : cmdLines) {
    fout << c << '\n' << check_error << '\n';
  }
}